

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_getfreeblock(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  char *pcVar3;
  DLword *pDVar4;
  int *piVar5;
  bool bVar6;
  LispPTR local_3318;
  char *local_3310;
  char *lf_cp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  statvfs sfsbuf;
  char ver [16];
  char file [4096];
  char name [256];
  char host [255];
  char dir [4096];
  char lfname [4101];
  int *buf;
  int rval;
  int dskp;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = &Dummy_errno;
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      buf._0_4_ = pLVar2[2];
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      buf._0_4_ = pLVar2[2] << 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if ((int)((LispPTR)buf + 1) < 0x1006) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_3318 = pLVar2[2];
      }
      else {
        local_3318 = 0x1000;
      }
      pcVar3 = (char *)(long)(int)local_3318;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(dir + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pcVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (dir + 0xff8)[(long)pcVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(dir + 0xff8);
        for (lf_cp = (char *)0x0; lf_cp < pcVar3; lf_cp = lf_cp + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      pLVar2 = NativeAligned4FromLAddr(args[1]);
      separate_host(dir + 0xff8,name + 0xf8);
      for (local_3310 = name + 0xf8; *local_3310 != '\0'; local_3310 = local_3310 + 1) {
        if (('`' < *local_3310) && (*local_3310 < '{')) {
          *local_3310 = *local_3310 + -0x20;
        }
      }
      iVar1 = strcmp(name + 0xf8,"DSK");
      if (iVar1 == 0) {
        bVar6 = true;
      }
      else {
        iVar1 = strcmp(name + 0xf8,"UNIX");
        if (iVar1 != 0) {
          return 0;
        }
        bVar6 = false;
      }
      iVar1 = unixpathname(dir + 0xff8,ver + 8,0,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        iVar1 = unpack_filename(ver + 8,host + 0xf8,file + 0xff8,(char *)(sfsbuf.__f_spare + 4),0);
        if (iVar1 == 0) {
          args_local._4_4_ = 0;
        }
        else if ((bVar6) && (iVar1 = true_name(host + 0xf8), iVar1 != -1)) {
          args_local._4_4_ = 0;
        }
        else {
          alarm(TIMEOUT_TIME);
          do {
            piVar5 = __errno_location();
            *piVar5 = 0;
            iVar1 = statvfs(host + 0xf8,(statvfs *)&lf_arrayp);
            bVar6 = false;
            if (iVar1 == -1) {
              piVar5 = __errno_location();
              bVar6 = *piVar5 == 4;
            }
          } while (bVar6);
          alarm(0);
          if (iVar1 == 0) {
            *pLVar2 = (LispPTR)sfsbuf.f_bfree;
            args_local._4_4_ = 0x4c;
          }
          else {
            piVar5 = __errno_location();
            *Lisp_errno = *piVar5;
            args_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_getfreeblock(LispPTR *args)
{
  int dskp, rval, *buf;
  char lfname[MAXPATHLEN + 5], dir[MAXPATHLEN], host[MAXNAMLEN];
  char name[MAXNAMLEN + 1], file[MAXPATHLEN], ver[VERSIONLEN];
#ifdef DOS
  char drive[2];
  struct diskfree_t sfsbuf;
#else
  struct statvfs sfsbuf;
#endif

  ERRSETJMP(NIL);
  Lisp_errno = &Dummy_errno;

  LispStringLength(args[0], rval, dskp);
  /*
   * Add 1 byte for NULL terminating character.
   */
  rval += 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
  buf = (int *)NativeAligned4FromLAddr(args[1]);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

#ifdef DOS
  if (!unixpathname(lfname, file, 0, 0, drive, 0, 0)) return (NIL);
#else  /* DOS */
  if (!unixpathname(lfname, file, 0, 0)) return (NIL);
#endif /* DOS */

  if (!unpack_filename(file, dir, name, ver, 0)) return (NIL);

  if (dskp) {
    /*
     * Although Lisp code guarantees the directory is an existing one,
     * by calling DSK_getfilename, we check it again for safety.
     */
    if (true_name(dir) != -1) return (NIL);
  }

/*
 * The specified file itself might be a file being created newly.  Thus,
 * we check the available block size, using the directory on which the file
 * will be exist.
 */
#ifdef DOS
  /* For DOS, we have to use either the disk drive the file
     will be on, or the default drive. */

  if (drive[0]) {
    drive[1] = 0;
    UPCASE(drive);
    if (_dos_getdiskfree((unsigned)drive[0] - (int)'@', &sfsbuf))
      return (NIL); /* call failed, so name is invalid */

    *buf = sfsbuf.avail_clusters * sfsbuf.sectors_per_cluster * sfsbuf.bytes_per_sector;
  } else {
    if (_dos_getdiskfree(0, &sfsbuf)) return (NIL); /* call failed, so name is invalid */

    *buf = sfsbuf.avail_clusters * sfsbuf.sectors_per_cluster * sfsbuf.bytes_per_sector;
  }
#else
  TIMEOUT(rval = statvfs(dir, &sfsbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }
  *buf = sfsbuf.f_bavail;
#endif /* DOS */
  return (ATOM_T);
}